

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall wasm::String::convertWTF8ToWTF16(String *this,ostream *os,string_view str)

{
  _Storage<unsigned_int,_true> _Var1;
  _Optional_payload_base<unsigned_int> _Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 local_40 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  if (os == (ostream *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    local_40 = (undefined1  [8])os;
    bVar4 = false;
    do {
      _Var2 = (_Optional_payload_base<unsigned_int>)
              anon_unknown_0::takeWTF8CodePoint((string_view *)local_40);
      if (((ulong)_Var2 >> 0x20 & 1) == 0) {
        _Var2._M_payload = (_Storage<unsigned_int,_true>)0xfffd;
        _Var2._M_engaged = false;
        _Var2._5_3_ = 0;
        bVar5 = false;
        bVar6 = false;
        bVar3 = false;
      }
      else {
        _Var1 = _Var2._M_payload;
        bVar3 = bVar5;
        if (_Var1._M_value < 0xd800) {
          bVar6 = false;
        }
        else {
          bVar6 = _Var1._M_value < 0xdc00;
          if (!bVar6) {
            bVar6 = false;
            bVar3 = (bool)(0xdfff < _Var1._M_value & bVar5);
          }
        }
      }
      if (bVar4) {
        bVar5 = bVar3;
      }
      writeWTF16CodePoint((ostream *)this,_Var2._M_payload._M_value);
      bVar4 = bVar6;
    } while (local_40 != (undefined1  [8])0x0);
  }
  return bVar5;
}

Assistant:

bool convertWTF8ToWTF16(std::ostream& os, std::string_view str) {
  bool valid = true;
  bool lastWasLeadingSurrogate = false;

  while (str.size()) {
    auto u = takeWTF8CodePoint(str);
    if (!u) {
      valid = false;
      u = replacementCharacter;
    }

    bool isLeadingSurrogate = 0xD800 <= *u && *u < 0xDC00;
    bool isTrailingSurrogate = 0xDC00 <= *u && *u < 0xE000;
    if (lastWasLeadingSurrogate && isTrailingSurrogate) {
      // Invalid surrogate sequence.
      valid = false;
    }
    lastWasLeadingSurrogate = isLeadingSurrogate;

    writeWTF16CodePoint(os, *u);
  }

  return valid;
}